

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O1

osfildef * CCharmap::open_map_file(CResLoader *res_loader,char *table_name,charmap_type_t *map_type)

{
  bool bVar1;
  bool bVar2;
  FILE *__stream;
  long __off;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  charmap_type_t cVar7;
  ulong uVar8;
  uint uVar9;
  uchar buf [256];
  char respath [100];
  undefined1 local_198 [2];
  ushort auStack_196 [127];
  char local_98 [104];
  
  t3sprintf(local_98,100,"charmap/%s.tcm",table_name);
  t3strlwr(local_98);
  __stream = (FILE *)CResLoader::open_res_file(res_loader,local_98,"charmap/cmaplib","CLIB");
  if (__stream != (FILE *)0x0) {
    __off = ftell(__stream);
    sVar3 = fread(local_198,6,1,__stream);
    if (sVar3 == 1) {
      uVar9 = (uint)auStack_196[1];
      bVar1 = false;
      bVar2 = false;
      do {
        if (uVar9 == 0) goto LAB_00225c9a;
        uVar8 = 0x40;
        if (uVar9 < 0x40) {
          uVar8 = (ulong)uVar9;
        }
        sVar3 = fread(local_198,(ulong)(uint)((int)uVar8 * 4),1,__stream);
        iVar6 = 2;
        if (sVar3 == 1) {
          uVar4 = 0;
          do {
            if (auStack_196[uVar4 * 2] < 0x100) {
              bVar1 = true;
            }
            else {
              bVar2 = true;
            }
            uVar4 = uVar4 + 1;
          } while (uVar8 != uVar4);
          uVar9 = uVar9 - (int)uVar8;
          bVar5 = bVar2 && bVar1;
          if (bVar2 && bVar1) {
            bVar2 = true;
            bVar1 = true;
          }
          iVar6 = (uint)bVar5 << 2;
        }
      } while (iVar6 == 0);
      if (iVar6 != 2) {
LAB_00225c9a:
        cVar7 = CHARMAP_TYPE_MB;
        if (!bVar2) {
          cVar7 = (uint)bVar2;
        }
        if (!bVar1) {
          cVar7 = (uint)bVar2;
        }
        *map_type = cVar7;
        fseek(__stream,__off,0);
        return (osfildef *)__stream;
      }
    }
    fclose(__stream);
  }
  return (osfildef *)0x0;
}

Assistant:

osfildef *CCharmap::open_map_file(class CResLoader *res_loader,
                                  const char *table_name,
                                  charmap_type_t *map_type)
{
    osfildef *fp;
    char respath[100];
    ulong startpos;
    uchar buf[256];
    uint entry_cnt;
    int found_single;
    int found_double;

    /*
     *   Generate the full resource path - character mapping resource paths
     *   always start with "charmap/" followed by the table name, plus the
     *   ".tcm" extension.  We use lower-case names for the mapping files, so
     *   explicitly convert to lower, in case we're on a case-sensitive file
     *   system like Unix.  
     */
    t3sprintf(respath, sizeof(respath), "charmap/%s.tcm", table_name);
    t3strlwr(respath);

    /* open the file for the character set */
    fp = res_loader->open_res_file(respath, "charmap/cmaplib", "CLIB");

    /* if we couldn't open the mapping file, return failure */
    if (fp == 0)
        return 0;

    /* note the initial seek position */
    startpos = osfpos(fp);

    /* read the header and the local-to-unicode header */
    if (osfrb(fp, buf, 6))
        goto fail;

    /* get the number of entries from the local-to-unicode header */
    entry_cnt = osrp2(buf + 4);

    /* 
     *   Scan the entries to determine if we have single-byte,
     *   double-byte, or both.  
     */
    found_single = found_double = FALSE;
    while (entry_cnt > 0)
    {
        size_t cur;
        const uchar *p;

        /* read up to a buffer-full or the remaining size */
        cur = sizeof(buf)/4;
        if (cur > entry_cnt)
            cur = entry_cnt;

        /* read it */
        if (osfrb(fp, buf, cur*4))
            goto fail;

        /* deduct the amount we just read from the amount remaining */
        entry_cnt -= cur;

        /* scan the entries */
        for (p = buf ; cur > 0 ; --cur, p += 4)
        {
            /* 
             *   Note whether this is a single-byte or double-byte entry.
             *   If the high-order byte is non-zero, it's a double-byte
             *   entry; otherwise, it's a single-byte entry.
             *   
             *   Note that we read the UINT2 at (p+2), because that's the
             *   local character-set code point in this tuple.  
             */
            if (((uint)osrp2(p + 2)) > 0xFF)
                found_double = TRUE;
            else
                found_single = TRUE;
        }

        /* 
         *   if we've found both single- and double-byte characters so
         *   far, there's no need to look any further, since we know
         *   everything about the file now 
         */
        if (found_single && found_double)
            break;
    }

    /* 
     *   create the appropriate mapper, depending on whether we found
     *   single, double, or mixed characters 
     */
    if (found_single && found_double)
    {
        /* it's mixed */
        *map_type = CHARMAP_TYPE_MB;
    }
    else if (found_double)
    {
        /* it's all double-byte */
        *map_type = CHARMAP_TYPE_DB;
    }
    else if (found_single)
    {
        /* it's all single-byte */
        *map_type = CHARMAP_TYPE_SB;
    }
    else
    {
        /* no mappings found at all - presume it's a single-byte mapper */
        *map_type = CHARMAP_TYPE_SB;
    }

    /* seek back to the start of the table */
    osfseek(fp, startpos, OSFSK_SET);

    /* return the file pointer */
    return fp;

fail:
    /* close the file and return failure */
    osfcls(fp);
    return 0;
}